

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O1

void __thiscall
OpenMD::MatrixAccumulator::get95percentConfidenceInterval(MatrixAccumulator *this,ResultType *ret)

{
  double dVar1;
  size_t sVar2;
  uint i;
  long lVar3;
  uint j;
  long lVar4;
  double (*ret_00) [3];
  double dVar5;
  Mat3x3d sd;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  ret_00 = (double (*) [3])&local_78;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0.0;
  uStack_60 = 0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_38 = 0;
  getStdDev(this,(ResultType *)ret_00);
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      dVar1 = (((SquareMatrix<double,_3> *)*ret_00)->super_RectMatrix<double,_3U,_3U>).data_[0]
              [lVar4];
      sVar2 = (this->super_BaseAccumulator).Count_;
      dVar5 = ((double)CONCAT44(0x45300000,(int)(sVar2 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      (((SquareMatrix<double,_3> *)*(double (*) [3])ret)->super_RectMatrix<double,_3U,_3U>).data_[0]
      [lVar4] = (dVar1 * 1.96) / dVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    ret_00 = ret_00 + 1;
    ret = (ResultType *)((long)ret + 0x18);
  } while (lVar3 != 3);
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      Mat3x3d sd;
      this->getStdDev(sd);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = 1.960 * sd(i, j) / sqrt(RealType(Count_));
        }
      }
      return;
    }